

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

void __thiscall rudp::session::disconnect(session *this)

{
  impl_type *piVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int in_R8D;
  impl_type *piStack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [2];
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  code *pcStack_10;
  
  generate_rst((session *)local_38);
  std::__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rudp::session,void>
            ((__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2> *)&piStack_50,
             (__weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_28._16_8_ = 0;
  pcStack_10 = (code *)0x0;
  local_28._0_8_ = (io_service *)0x0;
  local_28._8_8_ = (socket *)0x0;
  local_28._0_8_ = operator_new(0x18);
  _Var2._M_pi = local_48[0]._M_pi;
  piVar1 = piStack_50;
  local_48[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piStack_50 = (impl_type *)0x0;
  (((io_service *)local_28._0_8_)->super_execution_context).service_registry_ =
       (service_registry *)this;
  ((io_service *)local_28._0_8_)->impl_ = piVar1;
  (((io_service *)(local_28._0_8_ + 0x10))->super_execution_context).service_registry_ =
       (service_registry *)_Var2._M_pi;
  pcStack_10 = std::
               _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:192:34)>
               ::_M_invoke;
  local_28._16_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:192:34)>
       ::_M_manager;
  send(this,(int)local_38,(void *)0x0,(size_t)local_28,in_R8D);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return;
}

Assistant:

void session::disconnect() {
    send( generate_rst(), false, [this,this_=shared_from_this()]( bool ) {
      close();
    } );
  }